

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTWave_SetMatrixCoefficients
                   (FACTWave *pWave,uint32_t uSrcChannelCount,uint32_t uDstChannelCount,
                   float *pMatrixCoefficients)

{
  float **ppfVar1;
  float *local_48;
  float *mtxTmp;
  float *mtxSrc;
  float *mtxDst;
  float *pfStack_28;
  uint32_t i;
  float *pMatrixCoefficients_local;
  uint32_t uDstChannelCount_local;
  uint32_t uSrcChannelCount_local;
  FACTWave *pWave_local;
  
  _uDstChannelCount_local = pWave;
  pMatrixCoefficients_local._4_4_ = uSrcChannelCount;
  pMatrixCoefficients_local._0_4_ = uDstChannelCount;
  pfStack_28 = pMatrixCoefficients;
  local_48 = (float *)0x0;
  if (pWave == (FACTWave *)0x0) {
    pWave_local._4_4_ = 1;
  }
  else {
    if ((uSrcChannelCount == 1) && (pWave->srcChannels == 2)) {
      ppfVar1 = (float **)
                ((long)&local_48 -
                ((ulong)pWave->srcChannels * (ulong)uDstChannelCount * 4 + 0xf & 0xfffffffffffffff0)
                );
      local_48 = (float *)ppfVar1;
      mtxSrc = (float *)ppfVar1;
      mtxTmp = pMatrixCoefficients;
      for (mtxDst._4_4_ = 0; mtxDst._4_4_ < (uint32_t)pMatrixCoefficients_local;
          mtxDst._4_4_ = mtxDst._4_4_ + 1) {
        *mtxSrc = *mtxTmp;
        mtxSrc[1] = *mtxTmp;
        mtxSrc = mtxSrc + 2;
        mtxTmp = mtxTmp + 1;
      }
      pMatrixCoefficients_local._4_4_ = 2;
      pfStack_28 = local_48;
    }
    else {
      ppfVar1 = &local_48;
      if ((uSrcChannelCount == 2) && (ppfVar1 = &local_48, pWave->srcChannels == 1)) {
        ppfVar1 = (float **)
                  ((long)&local_48 -
                  ((ulong)pWave->srcChannels * (ulong)uDstChannelCount * 4 + 0xf &
                  0xfffffffffffffff0));
        local_48 = (float *)ppfVar1;
        mtxSrc = (float *)ppfVar1;
        mtxTmp = pMatrixCoefficients;
        for (mtxDst._4_4_ = 0; mtxDst._4_4_ < (uint32_t)pMatrixCoefficients_local;
            mtxDst._4_4_ = mtxDst._4_4_ + 1) {
          *mtxSrc = (*mtxTmp + mtxTmp[1]) / 2.0;
          mtxSrc = mtxSrc + 1;
          mtxTmp = mtxTmp + 2;
        }
        pMatrixCoefficients_local._4_4_ = 1;
        pfStack_28 = local_48;
      }
    }
    *(float *)((long)ppfVar1 + -8) = 1.598461e-39;
    *(float *)((long)ppfVar1 + -4) = 0.0;
    FAudio_PlatformLockMutex(*(FAudioMutex *)((long)ppfVar1 + -8));
    *(float *)((long)ppfVar1 + -8) = 1.59852e-39;
    *(float *)((long)ppfVar1 + -4) = 0.0;
    FAudioVoice_SetOutputMatrix
              (*(FAudioVoice **)((long)ppfVar1 + 0x20),*(FAudioVoice **)((long)ppfVar1 + 0x18),
               (uint32_t)*(float *)((long)ppfVar1 + 0x14),(uint32_t)*(float *)((long)ppfVar1 + 0x10)
               ,*(float **)((long)ppfVar1 + 8),(uint32_t)*(float *)((long)ppfVar1 + 4));
    *(float *)((long)ppfVar1 + -8) = 1.598551e-39;
    *(float *)((long)ppfVar1 + -4) = 0.0;
    FAudio_PlatformUnlockMutex(*(FAudioMutex *)((long)ppfVar1 + -8));
    pWave_local._4_4_ = 0;
  }
  return pWave_local._4_4_;
}

Assistant:

uint32_t FACTWave_SetMatrixCoefficients(
	FACTWave *pWave,
	uint32_t uSrcChannelCount,
	uint32_t uDstChannelCount,
	float *pMatrixCoefficients
) {
	uint32_t i;
	float *mtxDst, *mtxSrc, *mtxTmp = NULL;
	if (pWave == NULL)
	{
		return 1;
	}

	/* There seems to be this weird feature in XACT where the channel count
	 * can be completely wrong and it'll go to the right place.
	 * I guess these XACT functions do some extra work to merge coefficients
	 * but I have no idea where it really happens and XAudio2 definitely
	 * does NOT like it when this is wrong, so here it goes...
	 * -flibit
	 */
	if (uSrcChannelCount == 1 && pWave->srcChannels == 2)
	{
		mtxTmp = (float*) FAudio_alloca(
			sizeof(float) *
			pWave->srcChannels *
			uDstChannelCount
		);
		mtxDst = mtxTmp;
		mtxSrc = pMatrixCoefficients;
		for (i = 0; i < uDstChannelCount; i += 1)
		{
			mtxDst[0] = *mtxSrc;
			mtxDst[1] = *mtxSrc;
			mtxDst += 2;
			mtxSrc += 1;
		}
		uSrcChannelCount = 2;
		pMatrixCoefficients = mtxTmp;
	}
	else if (uSrcChannelCount == 2 && pWave->srcChannels == 1)
	{
		mtxTmp = (float*) FAudio_alloca(
			sizeof(float) *
			pWave->srcChannels *
			uDstChannelCount
		);
		mtxDst = mtxTmp;
		mtxSrc = pMatrixCoefficients;
		for (i = 0; i < uDstChannelCount; i += 1)
		{
			*mtxDst = (mtxSrc[0] + mtxSrc[1]) / 2.0f;
			mtxDst += 1;
			mtxSrc += 2;
		}
		uSrcChannelCount = 1;
		pMatrixCoefficients = mtxTmp;
	}

	FAudio_PlatformLockMutex(pWave->parentBank->parentEngine->apiLock);

	FAudioVoice_SetOutputMatrix(
		pWave->voice,
		pWave->voice->sends.pSends->pOutputVoice,
		uSrcChannelCount,
		uDstChannelCount,
		pMatrixCoefficients,
		0
	);

	FAudio_PlatformUnlockMutex(pWave->parentBank->parentEngine->apiLock);
	if (mtxTmp != NULL)
	{
		FAudio_dealloca(mtxTmp);
	}
	return 0;
}